

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O3

void pzshape::TPZShapePiram::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double *pdVar8;
  long *plVar9;
  long lVar10;
  bool bVar11;
  int transformation_index;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int xj;
  long lVar19;
  long lVar20;
  TPZVec<double> *pt_00;
  long lVar21;
  long lVar22;
  int xj_2;
  long lVar23;
  ulong uVar24;
  int xj_1;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar32 [16];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  TPZManVector<double,_1> outvalvec;
  TPZManVector<double,_2> outval;
  TPZManVector<long,_10> ids_1;
  TPZVec<long> ids;
  REAL store1 [20];
  REAL store2 [60];
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  long local_ea8;
  long local_ea0;
  long local_e70;
  int (*local_e60) [4];
  TPZVec<double> local_e20;
  double local_e00;
  _func_int **local_df8;
  TPZVec<long> *local_df0;
  TPZFMatrix<double> local_de8;
  double *local_d58;
  double *local_d50;
  TPZFMatrix<double> local_d48;
  TPZVec<long> local_cb8;
  undefined1 local_c98 [72];
  undefined1 local_c50 [16];
  int local_c40 [6];
  undefined **local_c28;
  undefined1 local_c20 [16];
  int64_t local_c10;
  double local_c08 [62];
  undefined1 local_a18 [72];
  undefined1 local_9d0 [16];
  int local_9c0 [6];
  undefined **local_9a8;
  undefined1 local_9a0 [16];
  int64_t local_990;
  double local_988 [61];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_df0 = id;
  pztopology::TPZPyramid::CornerShape(pt,phi,dphi);
  bVar11 = true;
  lVar17 = 0;
  do {
    bVar11 = (bool)(bVar11 & order->fStore[lVar17] < 2);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0xe);
  if (!bVar11) {
    local_7a0.fElem = local_710;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x13;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_7a0.fSize = 100;
    local_7a0.fGiven = local_7a0.fElem;
    TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
    local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
    local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_7a0.fWork.fStore = (double *)0x0;
    local_7a0.fWork.fNElements = 0;
    local_7a0.fWork.fNAlloc = 0;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x13;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_3e8.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    lVar17 = 0;
    lVar23 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar23) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
         (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_7a0.fElem[lVar23] = phi->fElem[lVar23];
      lVar19 = 0;
      do {
        lVar21 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar21 <= lVar19) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_3e8.fElem +
         lVar19 * 8 + local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar17) =
             *(undefined8 *)((long)dphi->fElem + lVar19 * 8 + lVar21 * lVar17);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar23 = lVar23 + 1;
      lVar17 = lVar17 + 8;
    } while (lVar23 != 5);
    ShapeGenerating(pt_00,&local_7a0,&local_3e8);
    local_ea8 = 5;
    local_e70 = 0x28;
    lVar17 = 0;
    do {
      if (1 < order->fStore[lVar17]) {
        pdVar8 = pt->fStore;
        dVar1 = (double)(&gRibTrans3dPiram1d)[lVar17 * 3];
        dVar2 = (double)(&DAT_01a30438)[lVar17 * 3];
        dVar3 = pdVar8[1];
        dVar4 = *pdVar8;
        dVar5 = (double)(&DAT_01a30440)[lVar17 * 3];
        dVar6 = pdVar8[2];
        TPZVec<long>::TPZVec(&local_cb8,2);
        TPZVec<double>::TPZVec(&local_e20,0);
        local_e00 = dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3;
        local_e20._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7c18;
        local_e20.fNElements = 1;
        local_e20.fNAlloc = 0;
        iVar7 = pztopology::TPZPyramid::SideNodes[lVar17][1];
        plVar9 = local_df0->fStore;
        *local_cb8.fStore = plVar9[pztopology::TPZPyramid::SideNodes[lVar17][0]];
        local_cb8.fStore[1] = plVar9[iVar7];
        iVar25 = order->fStore[lVar17];
        iVar7 = iVar25 + -1;
        lVar23 = (long)iVar7;
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_018151d8;
        local_d48.fElem = (double *)local_c98;
        local_d48.fSize = 0x14;
        local_e20.fStore = &local_e00;
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar23;
        local_d48.fGiven = local_d48.fElem;
        TPZVec<int>::TPZVec(&local_d48.fPivot.super_TPZVec<int>,0);
        local_d48.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_d48.fPivot.super_TPZVec<int>.fStore = local_d48.fPivot.fExtAlloc;
        local_d48.fPivot.super_TPZVec<int>.fNElements = 0;
        local_d48.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_d48.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        local_d48.fWork.fStore = (double *)0x0;
        local_d48.fWork.fNElements = 0;
        local_d48.fWork.fNAlloc = 0;
        if (iVar7 == 0) {
          local_d48.fElem = (double *)0x0;
        }
        else if (0x15 < iVar25) {
          local_d48.fElem = (double *)operator_new__(lVar23 * 8);
        }
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
             local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffff0000;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_018151d8;
        local_de8.fElem = (double *)local_a18;
        local_de8.fSize = 0x3c;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar23;
        local_de8.fGiven = local_de8.fElem;
        TPZVec<int>::TPZVec(&local_de8.fPivot.super_TPZVec<int>,0);
        local_de8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_de8.fPivot.super_TPZVec<int>.fStore = local_de8.fPivot.fExtAlloc;
        local_de8.fPivot.super_TPZVec<int>.fNElements = 0;
        local_de8.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_de8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        local_de8.fWork.fStore = (double *)0x0;
        local_de8.fWork.fNElements = 0;
        local_de8.fWork.fNAlloc = 0;
        if (iVar7 == 0) {
          local_de8.fElem = (double *)0x0;
        }
        else if (0x15 < iVar25) {
          local_de8.fElem = (double *)operator_new__(lVar23 * 0x18);
        }
        memset(local_d48.fElem,0,
               local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
             local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
        memset(local_de8.fElem,0,
               local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
             local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffffff00;
        iVar12 = order->fStore[lVar17];
        transformation_index = TPZShapeLinear::GetTransformId1d(&local_cb8);
        TPZShapeLinear::ShapeInternal(&local_e20,iVar12,&local_d48,&local_de8,transformation_index);
        TransformDerivativeFromRibToPiram((int)lVar17,iVar7,&local_de8);
        if (1 < iVar25) {
          lVar19 = lVar17 + 5;
          local_ea8 = (long)(int)local_ea8;
          lVar21 = local_ea8 * 8;
          lVar18 = 0;
          lVar22 = 0;
          do {
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((local_ea8 < 0) ||
                ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea8)) ||
               ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[local_ea8] = local_7a0.fElem[lVar17 + 5] * local_d48.fElem[lVar22];
            lVar20 = 0;
            do {
              if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
                 (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar19)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                 (local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
                 (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
                 (local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar22)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if (((lVar10 <= lVar20) || (local_ea8 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(double *)((long)dphi->fElem + lVar20 * 8 + lVar10 * lVar21) =
                   *(double *)
                    ((long)local_3e8.fElem +
                    lVar20 * 8 +
                    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e70) *
                   local_d48.fElem[lVar22] +
                   local_7a0.fElem[lVar17 + 5] *
                   *(double *)
                    ((long)local_de8.fElem +
                    lVar20 * 8 + local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar18
                    );
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            local_ea8 = local_ea8 + 1;
            lVar22 = lVar22 + 1;
            lVar18 = lVar18 + 8;
            lVar21 = lVar21 + 8;
          } while (lVar22 != lVar23);
        }
        TPZFMatrix<double>::~TPZFMatrix(&local_de8);
        TPZFMatrix<double>::~TPZFMatrix(&local_d48);
        if (local_e20.fStore != &local_e00) {
          local_e20.fNAlloc = 0;
          local_e20._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_e20.fStore != (double *)0x0) {
            operator_delete__(local_e20.fStore);
          }
        }
        local_cb8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_cb8.fStore != (long *)0x0) {
          operator_delete__(local_cb8.fStore);
        }
      }
      lVar17 = lVar17 + 1;
      local_e70 = local_e70 + 8;
    } while (lVar17 != 8);
    local_d50 = local_988;
    local_d58 = local_c08;
    local_e70 = 0x68;
    local_df8 = (_func_int **)&PTR__TPZFNMatrix_018172c8;
    local_e60 = pztopology::TPZPyramid::FaceNodes;
    uVar16 = 0;
    do {
      if ((1 < order->fStore[uVar16 + 8]) && (uVar16 == 0 || order->fStore[uVar16 + 8] != 2)) {
        TPZVec<double>::TPZVec((TPZVec<double> *)&local_de8,0);
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZManVector_0181c090;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)&local_de8.fElem;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
        ProjectPoint3dPiramToFace((int)uVar16,pt,(TPZVec<double> *)&local_de8);
        iVar7 = order->fStore[uVar16 | 8];
        if (uVar16 == 0 || 2 < iVar7) {
          if (uVar16 == 0) {
            iVar25 = (iVar7 + -1) * (iVar7 + -1);
          }
          else {
            iVar25 = ((iVar7 + -1) * (iVar7 + -2)) / 2;
          }
          uVar15 = (ulong)iVar25;
          local_a18._16_8_ = 1;
          local_a18._24_2_ = 0;
          local_a18._0_8_ = &PTR__TPZFMatrix_018175b8;
          local_a18._32_8_ = local_d50;
          local_a18._40_8_ = local_d50;
          local_a18._48_8_ = 0x3c;
          local_a18._8_8_ = uVar15;
          TPZVec<int>::TPZVec((TPZVec<int> *)(local_a18 + 0x38),0);
          local_a18._56_8_ = &PTR__TPZManVector_01815498;
          local_a18._64_8_ = local_9c0;
          local_9d0 = ZEXT816(0);
          local_9a8 = &PTR__TPZVec_01813df0;
          local_9a0 = ZEXT816(0);
          local_990 = 0;
          if (iVar25 == 0) {
            local_a18._32_8_ = (double *)0x0;
          }
          else if (0x3c < iVar25) {
            local_a18._32_8_ = operator_new__(uVar15 * 8);
          }
          local_a18._0_8_ = local_df8;
          local_c98._8_8_ = 3;
          local_c98._24_2_ = 0;
          local_c98._0_8_ = &PTR__TPZFMatrix_018175b8;
          local_c98._32_8_ = local_d58;
          local_c98._40_8_ = local_d58;
          local_c98._48_8_ = 0x3c;
          local_c98._16_8_ = uVar15;
          TPZVec<int>::TPZVec((TPZVec<int> *)(local_c98 + 0x38),0);
          local_c98._56_8_ = &PTR__TPZManVector_01815498;
          local_c98._64_8_ = local_c40;
          local_c50 = ZEXT816(0);
          local_c28 = &PTR__TPZVec_01813df0;
          local_c20 = ZEXT816(0);
          local_c10 = 0;
          if (iVar25 == 0) {
            local_c98._32_8_ = (double *)0x0;
          }
          else if (0x14 < iVar25) {
            local_c98._32_8_ = operator_new__(uVar15 * 0x18);
          }
          local_c98._0_8_ = local_df8;
          memset((void *)local_a18._32_8_,0,local_a18._8_8_ * local_a18._16_8_ * 8);
          local_a18._24_2_ = local_a18._24_2_ & 0xff00;
          memset((void *)local_c98._32_8_,0,local_c98._8_8_ * local_c98._16_8_ * 8);
          local_c98._24_2_ = local_c98._24_2_ & 0xff00;
          TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)&local_d48,4);
          plVar9 = local_df0->fStore;
          if (uVar16 == 0) {
            lVar17 = 0;
            do {
              *(long *)(local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar17 * 8) =
                   plVar9[pztopology::TPZPyramid::FaceNodes[0][lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
          }
          else {
            lVar17 = 0;
            do {
              *(long *)(local_d48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar17 * 8) =
                   plVar9[(*local_e60)[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
          }
          if (uVar16 == 0) {
            iVar12 = TPZShapeQuad::GetTransformId2dQ((TPZVec<long> *)&local_d48);
            TPZShapeQuad::ShapeInternal
                      ((TPZVec<double> *)&local_de8,iVar7 + -2,(TPZFMatrix<double> *)local_a18,
                       (TPZFMatrix<double> *)local_c98,iVar12);
          }
          else {
            TPZManVector<long,_10>::Resize((TPZManVector<long,_10> *)&local_d48,3);
            iVar12 = TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)&local_d48);
            *(double **)local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (double *)
                 (((double)*(double **)local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
                  1.0) * 0.5);
            *(double **)(local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) =
                 (double *)
                 (((double)*(double **)
                            (local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) + 1.0)
                 * 0.5);
            TPZShapeTriang::ShapeInternal
                      ((TPZVec<double> *)&local_de8,iVar7 + -2,(TPZFMatrix<double> *)local_a18,
                       (TPZFMatrix<double> *)local_c98,iVar12);
            if (0 < (int)(uint)local_c98._16_8_) {
              uVar24 = 0;
              do {
                if (((long)local_c98._8_8_ < 1) || ((long)local_c98._16_8_ <= (long)uVar24)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar17 = local_c98._8_8_ * uVar24;
                *(double *)(local_c98._32_8_ + lVar17 * 8) =
                     *(double *)(local_c98._32_8_ + lVar17 * 8) * 0.5;
                if (((long)local_c98._8_8_ < 2) || ((long)local_c98._16_8_ <= (long)uVar24)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)(local_c98._32_8_ + (lVar17 + 1) * 8) =
                     *(double *)(local_c98._32_8_ + (lVar17 + 1) * 8) * 0.5;
                if (((long)local_c98._8_8_ < 3) || ((long)local_c98._16_8_ <= (long)uVar24)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)(local_c98._32_8_ + (lVar17 + 2) * 8) =
                     *(double *)(local_c98._32_8_ + (lVar17 + 2) * 8) * 0.5;
                uVar24 = uVar24 + 1;
              } while (((uint)local_c98._16_8_ & 0x7fffffff) != uVar24);
            }
          }
          TransformDerivativeFromFaceToPiram((int)uVar16,iVar25,(TPZFMatrix<double> *)local_c98);
          if (0 < iVar25) {
            lVar17 = uVar16 + 0xd;
            local_ea8 = (long)(int)local_ea8;
            lVar23 = local_ea8 * 8;
            lVar19 = 0;
            uVar24 = 0;
            do {
              if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                 (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((long)local_a18._8_8_ <= (long)uVar24) || ((long)local_a18._16_8_ < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_ea8 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea8)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_ea8] =
                   local_7a0.fElem[uVar16 + 0xd] * *(double *)(local_a18._32_8_ + uVar24 * 8);
              lVar21 = 0;
              do {
                if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) ||
                   (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar17)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((long)local_a18._8_8_ <= (long)uVar24) || ((long)local_a18._16_8_ < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                   (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((long)local_c98._8_8_ <= lVar21) || ((long)local_c98._16_8_ <= (long)uVar24)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar18 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                if (((lVar18 <= lVar21) || (local_ea8 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea8)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)((long)dphi->fElem + lVar21 * 8 + lVar18 * lVar23) =
                     *(double *)
                      ((long)local_3e8.fElem +
                      lVar21 * 8 +
                      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e70) *
                     *(double *)(local_a18._32_8_ + uVar24 * 8) +
                     local_7a0.fElem[uVar16 + 0xd] *
                     *(double *)(local_c98._32_8_ + lVar21 * 8 + local_c98._8_8_ * lVar19);
                lVar21 = lVar21 + 1;
              } while (lVar21 != 3);
              local_ea8 = local_ea8 + 1;
              uVar24 = uVar24 + 1;
              lVar19 = lVar19 + 8;
              lVar23 = lVar23 + 8;
            } while (uVar24 != uVar15);
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&local_d48);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_c98,&PTR_PTR_01817580);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_a18,&PTR_PTR_01817580);
        }
        if ((double **)local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
            &local_de8.fElem) {
          local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
          local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZVec_01813df0;
          if ((double **)local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
              (double **)0x0) {
            operator_delete__((void *)local_de8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
          }
        }
      }
      uVar16 = uVar16 + 1;
      local_e60 = local_e60 + 1;
      local_e70 = local_e70 + 8;
    } while (uVar16 != 5);
    iVar7 = order->fStore[0xd];
    if (2 < iVar7) {
      uVar13 = iVar7 + 1U & 0xfffffffc;
      uVar14 = iVar7 - 3;
      uVar26 = 0;
      uVar27 = 1;
      uVar28 = 2;
      uVar29 = 3;
      uVar31 = 0;
      uVar34 = 0;
      uVar36 = 0;
      uVar38 = 0;
      do {
        uVar37 = uVar38;
        uVar35 = uVar36;
        uVar33 = uVar34;
        uVar30 = uVar31;
        uVar42 = uVar29;
        uVar41 = uVar28;
        uVar40 = uVar27;
        uVar39 = uVar26;
        auVar32._0_4_ = uVar39 + 1;
        auVar32._4_4_ = uVar40 + 1;
        auVar32._8_4_ = uVar41 + 1;
        auVar32._12_4_ = uVar42 + 1;
        auVar43._4_4_ = uVar40 + 2;
        auVar43._12_4_ = uVar42 + 2;
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        uVar31 = (auVar32._0_4_ * (uVar39 + 2) >> 1) + uVar30;
        uVar34 = ((uint)(auVar43._4_4_ * auVar32._4_4_) >> 1) + uVar33;
        uVar36 = ((uint)((auVar32._8_8_ & 0xffffffff) * (ulong)(uVar41 + 2)) >> 1) + uVar35;
        uVar38 = ((uint)((auVar43._8_8_ & 0xffffffff) * (ulong)auVar32._12_4_) >> 1) + uVar37;
        uVar13 = uVar13 - 4;
        uVar26 = uVar39 + 4;
        uVar27 = uVar40 + 4;
        uVar28 = uVar41 + 4;
        uVar29 = uVar42 + 4;
      } while (uVar13 != 0);
      uVar26 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
      uVar27 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
      uVar28 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar41 ^ 0x80000000));
      uVar29 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar42 ^ 0x80000000));
      uVar26 = (~uVar29 & uVar38 | uVar37 & uVar29) + (~uVar27 & uVar34 | uVar33 & uVar27) +
               (~uVar28 & uVar36 | uVar35 & uVar28) + (~uVar26 & uVar31 | uVar30 & uVar26);
      uVar16 = (ulong)uVar26;
      local_a18._32_8_ = local_988;
      local_a18._16_8_ = 1;
      local_a18._24_2_ = 0;
      local_a18._0_8_ = &PTR__TPZFMatrix_018b80b8;
      local_a18._48_8_ = 0x28;
      local_a18._8_8_ = uVar16;
      local_a18._40_8_ = local_a18._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_a18 + 0x38),0);
      local_a18._56_8_ = &PTR__TPZManVector_01815498;
      local_a18._64_8_ = local_9c0;
      local_9d0 = (undefined1  [16])0x0;
      local_9a8 = &PTR__TPZVec_01813df0;
      local_9a0 = (undefined1  [16])0x0;
      local_990 = 0;
      if (0x28 < uVar26) {
        local_a18._32_8_ = operator_new__(uVar16 * 8);
      }
      local_a18._0_8_ = &PTR__TPZFNMatrix_018b7dc8;
      local_c98._32_8_ = local_c08;
      local_c98._8_8_ = 3;
      local_c98._24_2_ = 0;
      local_c98._0_8_ = &PTR__TPZFMatrix_018b80b8;
      local_c98._48_8_ = 0x28;
      local_c98._16_8_ = uVar16;
      local_c98._40_8_ = local_c98._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_c98 + 0x38),0);
      local_c98._56_8_ = &PTR__TPZManVector_01815498;
      local_c98._64_8_ = local_c40;
      local_c50 = (undefined1  [16])0x0;
      local_c28 = &PTR__TPZVec_01813df0;
      local_c20 = (undefined1  [16])0x0;
      local_c10 = 0;
      if (0xd < uVar26) {
        local_c98._32_8_ = operator_new__(uVar16 * 0x18);
      }
      local_c98._0_8_ = &PTR__TPZFNMatrix_018b7dc8;
      memset((void *)local_a18._32_8_,0,local_a18._8_8_ * local_a18._16_8_ * 8);
      local_a18._24_2_ = local_a18._24_2_ & 0xff00;
      memset((void *)local_c98._32_8_,0,local_c98._8_8_ * local_c98._16_8_ * 8);
      local_c98._24_2_ = local_c98._24_2_ & 0xff00;
      ShapeInternal(pt,order->fStore[0xd],(TPZFMatrix<double> *)local_a18,
                    (TPZFMatrix<double> *)local_c98);
      local_ea0 = (long)(int)local_ea8;
      local_ea8 = local_ea0 * 8;
      lVar17 = 0;
      uVar15 = 0;
      do {
        if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x13) ||
           (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((long)local_a18._8_8_ <= (long)uVar15) || ((long)local_a18._16_8_ < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_ea0 < 0) ||
            ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea0)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[local_ea0] = local_7a0.fElem[0x12] * *(double *)(local_a18._32_8_ + uVar15 * 8);
        lVar23 = 0;
        do {
          if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
             (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0x13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_a18._8_8_ <= (long)uVar15) || ((long)local_a18._16_8_ < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x13) ||
             (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_c98._8_8_ <= lVar23) || ((long)local_c98._16_8_ <= (long)uVar15)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar19 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar19 <= lVar23) || (local_ea0 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea0)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)((long)dphi->fElem + lVar23 * 8 + lVar19 * local_ea8) =
               local_3e8.fElem
               [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0x12 + lVar23] *
               *(double *)(local_a18._32_8_ + uVar15 * 8) +
               local_7a0.fElem[0x12] *
               *(double *)(local_c98._32_8_ + lVar23 * 8 + local_c98._8_8_ * lVar17);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        local_ea0 = local_ea0 + 1;
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 8;
        local_ea8 = local_ea8 + 8;
      } while (uVar15 != uVar16);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_c98,&PTR_PTR_018b8080);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_a18,&PTR_PTR_018b8080);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_018379a8);
  }
  return;
}

Assistant:

void TPZShapePiram::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
        for(is=NCornerNodes; is<NSides; is++){
            if(order[is-NCornerNodes] > 1){
                linear = false;
            }
        }
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[13]<2) return;//order tem as ordens dos lados do elemento
		int shape = 5;
		//rib shapes
		for (int rib = 0; rib < 8; rib++) {//todas as arestas
			if (order[rib] <2 ) continue;
			REAL outval;
			ProjectPoint3dPiramToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPiram(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+5,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+5) * phin( i, 0) +
					phiblend(rib+5, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}

		for (int face = 0; face < 5; face++) {
			if (order[face+8] < 2) continue;
			if(face>0 && order[face+8]<=2) continue;//s� a face 13 tem shape associada com ordem p=2
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dPiramToFace(face,pt,outval);
			int ord1;//,ord2;
			ord1 = order[8+face];
			//ord2 = ord1;
			//FaceOrder(face,ord1,ord2);//ordem da face
			if(face && ord1<3) continue;//uma face com ordem < 3 n�o tem shape associada
			int nshape;
			if(!face) nshape = (ord1-1)*(ord1-1);//face quadrada
			else nshape = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFNMatrix<60> phin(nshape,1),dphin(3,nshape);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2;
			int i;
			if(!face) for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//	id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//	id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			// 	id2 = ShapeFaceId[face][2];//if(face == 0) id3 = ShapeFaceId[face][3];
			int transid;
			if(!face) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(int i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPiram(face,nshape,dphin);//ordin = numero de shapes
			for(i=0;i<nshape;i++)	{
				phi(shape,0) = phiblend(face+13,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+13)* phin(i ,0) +
					phiblend(face+13, 0)*dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[13]<3) return;//n�o h� ordens para cantos
		//volume shapes
		int nshape=0,i;
		for(i=0;i<order[13]-2;i++) {
			nshape += (i+1)*(i+2) / 2;
		}
		TPZFNMatrix<40> phin(nshape,1),dphin(3,nshape);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[13],phin,dphin);
		for(i=0;i<nshape;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}